

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ExtensionGenerator::ExtensionGenerator
          (ExtensionGenerator *this,FieldDescriptor *descriptor)

{
  Descriptor *pDVar1;
  FileDescriptor *this_00;
  Descriptor *descriptor_00;
  FileDescriptor *descriptor_01;
  string local_68;
  string local_48;
  FieldDescriptor *local_18;
  FieldDescriptor *descriptor_local;
  ExtensionGenerator *this_local;
  
  this->descriptor_ = descriptor;
  local_18 = descriptor;
  descriptor_local = (FieldDescriptor *)this;
  std::__cxx11::string::string((string *)&this->scope_);
  pDVar1 = FieldDescriptor::extension_scope(this->descriptor_);
  if (pDVar1 == (Descriptor *)0x0) {
    this_00 = FieldDescriptor::file(this->descriptor_);
    ClassName_abi_cxx11_(&local_68,(java *)this_00,descriptor_01);
    std::__cxx11::string::operator=((string *)&this->scope_,(string *)&local_68);
    std::__cxx11::string::~string((string *)&local_68);
  }
  else {
    pDVar1 = FieldDescriptor::extension_scope(this->descriptor_);
    ClassName_abi_cxx11_(&local_48,(java *)pDVar1,descriptor_00);
    std::__cxx11::string::operator=((string *)&this->scope_,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
  }
  return;
}

Assistant:

ExtensionGenerator::ExtensionGenerator(const FieldDescriptor* descriptor)
  : descriptor_(descriptor) {
  if (descriptor_->extension_scope() != NULL) {
    scope_ = ClassName(descriptor_->extension_scope());
  } else {
    scope_ = ClassName(descriptor_->file());
  }
}